

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v4::load_s_smparams(xr_ogf_v4 *this,xr_reader *r)

{
  xr_reader *this_00;
  bool bVar1;
  uint16_t uVar2;
  value_type this_01;
  reference ppxVar3;
  __normal_iterator<xray_re::xr_skl_motion_**,_std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>_>
  local_70;
  xr_skl_motion *local_68;
  xr_skl_motion **local_60;
  __normal_iterator<xray_re::xr_skl_motion_**,_std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>_>
  local_58;
  __normal_iterator<xray_re::xr_skl_motion_**,_std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>_>
  local_50 [3];
  value_type local_38;
  motion_io *smotion;
  size_t num_motions;
  uint16_t local_1a;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_ogf_v4 *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  local_1a = xr_reader::r_u16(r);
  if (local_1a != 3 && local_1a != 4) {
    __assert_fail("version == OGF4_S_SMPARAMS_VERSION_3 || version == OGF4_S_SMPARAMS_VERSION_4",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x1ae,"void xray_re::xr_ogf_v4::load_s_smparams(xr_reader &)");
  }
  bVar1 = std::vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>::empty
                    (&(this->super_xr_ogf).super_xr_object.m_partitions);
  this_00 = pxStack_18;
  if (!bVar1) {
    __assert_fail("m_partitions.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x1b0,"void xray_re::xr_ogf_v4::load_s_smparams(xr_reader &)");
  }
  uVar2 = xr_reader::r_u16(pxStack_18);
  read_partition_v4::read_partition_v4
            ((read_partition_v4 *)&num_motions,&(this->super_xr_ogf).super_xr_object.m_bones);
  xr_reader::
  r_seq<std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>,read_partition_v4>
            (this_00,(ulong)uVar2,&(this->super_xr_ogf).super_xr_object.m_partitions,
             (read_partition_v4)num_motions);
  xr_object::setup_partitions((xr_object *)this);
  bVar1 = std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::empty
                    (&(this->super_xr_ogf).super_xr_object.m_motions);
  if (!bVar1) {
    __assert_fail("m_motions.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x1b4,"void xray_re::xr_ogf_v4::load_s_smparams(xr_reader &)");
  }
  uVar2 = xr_reader::r_u16(pxStack_18);
  smotion = (motion_io *)(ulong)uVar2;
  std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::resize
            (&(this->super_xr_ogf).super_xr_object.m_motions,(size_type)smotion);
  for (; smotion != (motion_io *)0x0;
      smotion = (motion_io *)
                ((long)&smotion[-1].super_xr_skl_motion.m_marks.
                        super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
    this_01 = (value_type)operator_new(0x88);
    motion_io::motion_io((motion_io *)this_01);
    local_38 = this_01;
    uVar2 = motion_io::import_params((motion_io *)this_01,pxStack_18,(uint)local_1a);
    ppxVar3 = std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::at
                        (&(this->super_xr_ogf).super_xr_object.m_motions,(ulong)uVar2);
    *ppxVar3 = this_01;
  }
  local_58._M_current =
       (xr_skl_motion **)
       std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::begin
                 (&(this->super_xr_ogf).super_xr_object.m_motions);
  local_60 = (xr_skl_motion **)
             std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::end
                       (&(this->super_xr_ogf).super_xr_object.m_motions);
  local_68 = (xr_skl_motion *)0x0;
  local_50[0] = std::
                find<__gnu_cxx::__normal_iterator<xray_re::xr_skl_motion**,std::vector<xray_re::xr_skl_motion*,std::allocator<xray_re::xr_skl_motion*>>>,xray_re::xr_skl_motion*>
                          (local_58,(__normal_iterator<xray_re::xr_skl_motion_**,_std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>_>
                                     )local_60,&local_68);
  local_70._M_current =
       (xr_skl_motion **)
       std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::end
                 (&(this->super_xr_ogf).super_xr_object.m_motions);
  bVar1 = __gnu_cxx::operator==(local_50,&local_70);
  if (!bVar1) {
    __assert_fail("std::find(m_motions.begin(), m_motions.end(), static_cast<xr_skl_motion*>(0)) == m_motions.end()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x1bb,"void xray_re::xr_ogf_v4::load_s_smparams(xr_reader &)");
  }
  xr_ogf::set_chunk_loaded(&this->super_xr_ogf,0xf);
  return;
}

Assistant:

void xr_ogf_v4::load_s_smparams(xr_reader& r)
{
	uint16_t version = r.r_u16();
	xr_assert(version == OGF4_S_SMPARAMS_VERSION_3 || version == OGF4_S_SMPARAMS_VERSION_4);

	assert(m_partitions.empty());
	r.r_seq(r.r_u16(), m_partitions, read_partition_v4(m_bones));
	setup_partitions();

	assert(m_motions.empty());
	size_t num_motions = r.r_u16();
	m_motions.resize(num_motions);
	for (; num_motions; --num_motions) {
		motion_io* smotion = new xr_ogf_v4::motion_io;
		m_motions.at(smotion->import_params(r, version)) = smotion;
	}
	assert(std::find(m_motions.begin(), m_motions.end(), static_cast<xr_skl_motion*>(0)) == m_motions.end());

	set_chunk_loaded(OGF4_S_SMPARAMS);
}